

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

void __thiscall DACSThinker::Serialize(DACSThinker *this,FSerializer *arc)

{
  undefined8 uVar1;
  bool bVar2;
  hash_t hVar3;
  FSerializer *this_00;
  DLevelScript **ppDVar4;
  undefined1 local_60 [8];
  SavingRunningscript srs_1;
  uint i;
  uint cnt;
  DLevelScript *script;
  SavingRunningscript srs;
  Pair *pair;
  Iterator it;
  FSerializer *arc_local;
  DACSThinker *this_local;
  
  it._8_8_ = arc;
  DObject::Serialize((DObject *)this,arc);
  this_00 = FSerializer::operator()((FSerializer *)it._8_8_,"scripts",&this->Scripts);
  FSerializer::operator()(this_00,"lastscript",&this->LastScript);
  bVar2 = FSerializer::isWriting((FSerializer *)it._8_8_);
  if (bVar2) {
    hVar3 = TMap<int,_DLevelScript_*,_THashTraits<int>,_TValueTraits<DLevelScript_*>_>::CountUsed
                      (&this->RunningScripts);
    if (hVar3 != 0) {
      TMapIterator<int,_DLevelScript_*,_TMap<int,_DLevelScript_*,_THashTraits<int>,_TValueTraits<DLevelScript_*>_>_>
      ::TMapIterator((TMapIterator<int,_DLevelScript_*,_TMap<int,_DLevelScript_*,_THashTraits<int>,_TValueTraits<DLevelScript_*>_>_>
                      *)&pair,&this->RunningScripts);
      FSerializer::BeginArray((FSerializer *)it._8_8_,"runningscripts");
      while (bVar2 = TMapIterator<int,_DLevelScript_*,_TMap<int,_DLevelScript_*,_THashTraits<int>,_TValueTraits<DLevelScript_*>_>_>
                     ::NextPair((TMapIterator<int,_DLevelScript_*,_TMap<int,_DLevelScript_*,_THashTraits<int>,_TValueTraits<DLevelScript_*>_>_>
                                 *)&pair,(Pair **)&srs.lscript), bVar2) {
        if (((srs.lscript)->super_DObject).Class == (PClass *)0x0) {
          __assert_fail("pair->Value != nullptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_acs.cpp"
                        ,0xb74,"virtual void DACSThinker::Serialize(FSerializer &)");
        }
        script._0_4_ = *(undefined4 *)&((srs.lscript)->super_DObject)._vptr_DObject;
        srs._0_8_ = ((srs.lscript)->super_DObject).Class;
        FSerializer::operator()((FSerializer *)it._8_8_,(char *)0x0,(SavingRunningscript *)&script);
      }
      FSerializer::EndArray((FSerializer *)it._8_8_);
    }
  }
  else {
    TMap<int,_DLevelScript_*,_THashTraits<int>,_TValueTraits<DLevelScript_*>_>::Clear
              (&this->RunningScripts,1);
    bVar2 = FSerializer::BeginArray((FSerializer *)it._8_8_,"runningscripts");
    if (bVar2) {
      srs_1.lscript._4_4_ = FSerializer::ArraySize((FSerializer *)it._8_8_);
      for (srs_1.lscript._0_4_ = 0; (uint)srs_1.lscript < srs_1.lscript._4_4_;
          srs_1.lscript._0_4_ = (uint)srs_1.lscript + 1) {
        FSerializer::operator()((FSerializer *)it._8_8_,(char *)0x0,(SavingRunningscript *)local_60)
        ;
        uVar1 = srs_1._0_8_;
        ppDVar4 = TMap<int,_DLevelScript_*,_THashTraits<int>,_TValueTraits<DLevelScript_*>_>::
                  operator[](&this->RunningScripts,local_60._0_4_);
        *ppDVar4 = (DLevelScript *)uVar1;
      }
      FSerializer::EndArray((FSerializer *)it._8_8_);
    }
  }
  return;
}

Assistant:

void DACSThinker::Serialize(FSerializer &arc)
{
	Super::Serialize(arc);
	arc("scripts", Scripts)
		("lastscript", LastScript);

	if (arc.isWriting())
	{
		if (RunningScripts.CountUsed())
		{
			ScriptMap::Iterator it(RunningScripts);
			ScriptMap::Pair *pair;

			arc.BeginArray("runningscripts");
			while (it.NextPair(pair))
			{
				assert(pair->Value != nullptr);
				SavingRunningscript srs = { pair->Key, pair->Value };
				arc(nullptr, srs);
			}
			arc.EndArray();
		}
	}
	else // Loading
	{
		DLevelScript *script = nullptr;
		RunningScripts.Clear();
		if (arc.BeginArray("runningscripts"))
		{
			auto cnt = arc.ArraySize();
			for (unsigned i = 0; i < cnt; i++)
			{
				SavingRunningscript srs;
				arc(nullptr, srs);
				RunningScripts[srs.scriptnum] = srs.lscript;
			}
			arc.EndArray();
		}
	}
}